

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O2

bool crt_pid_file(pid_t pid,string *path)

{
  bool bVar1;
  bool local_31;
  string local_30;
  
  to_str_abi_cxx11_(&local_30,pid);
  local_31 = false;
  bVar1 = write_file(path,&local_30,&local_31);
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool crt_pid_file(const pid_t pid, const std::string &path) {
    return write_file(path, to_str(pid));
}